

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_quantization.cc
# Opt level: O1

bool __thiscall
sptk::VectorQuantization::Run
          (VectorQuantization *this,vector<double,_std::allocator<double>_> *input_vector,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *codebook_vectors,int *codebook_index)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  double distance;
  int local_54;
  double local_50;
  double local_38;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if (((codebook_index != (int *)0x0) &&
        (uVar4 = (int)((long)(codebook_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(codebook_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555,
        bVar5 = false, uVar4 != 0)) &&
       ((long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)this->num_order_ + 1)) {
      bVar5 = (int)uVar4 < 1;
      if ((int)uVar4 < 1) {
        local_54 = 0;
      }
      else {
        lVar2 = 0;
        local_50 = 1.79769313486232e+308;
        uVar3 = 0;
        local_54 = 0;
        do {
          bVar1 = DistanceCalculation::Run
                            (&this->distance_calculation_,input_vector,
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&(((codebook_vectors->
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar2),&local_38);
          if ((bVar1) && (local_38 < local_50)) {
            local_54 = (int)uVar3;
            local_50 = local_38;
          }
          if (!bVar1) break;
          uVar3 = uVar3 + 1;
          bVar5 = (uVar4 & 0x7fffffff) <= uVar3;
          lVar2 = lVar2 + 0x18;
        } while ((uVar4 & 0x7fffffff) != uVar3);
      }
      if (bVar5) {
        *codebook_index = local_54;
        bVar5 = true;
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool VectorQuantization::Run(
    const std::vector<double>& input_vector,
    const std::vector<std::vector<double> >& codebook_vectors,
    int* codebook_index) const {
  // Check inputs.
  const int codebook_size(static_cast<int>(codebook_vectors.size()));
  if (!is_valid_ ||
      input_vector.size() != static_cast<std::size_t>(num_order_ + 1) ||
      0 == codebook_size || NULL == codebook_index) {
    return false;
  }

  int index(0);
  double min_distance(sptk::kMax);

  for (int i(0); i < codebook_size; ++i) {
    double distance;
    if (!distance_calculation_.Run(input_vector, codebook_vectors[i],
                                   &distance)) {
      return false;
    }
    if (distance < min_distance) {
      index = i;
      min_distance = distance;
    }
  }

  *codebook_index = index;

  return true;
}